

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O3

void __thiscall PointBlock<3U>::generate_points(PointBlock<3U> *this,Bounds *domain,size_t n)

{
  float fVar1;
  int iVar2;
  pointer pfVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator=
            ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)&this->box,
             (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)domain);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator=
            (&(this->box).max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,
             &(domain->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>);
  std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::resize
            (&this->points,n);
  if (n != 0) {
    pfVar3 = (domain->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
    lVar5 = 0;
    sVar6 = 0;
    do {
      lVar4 = 0;
      do {
        fVar1 = pfVar3[lVar4];
        iVar2 = rand();
        pfVar3 = (domain->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
        *(float *)((long)(((this->points).
                           super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_array<float,_3UL>).
                         _M_elems + lVar4 * 4 + lVar5) =
             ((domain->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin
              [lVar4] - pfVar3[lVar4]) * (float)(iVar2 % 0x400) * 0.0009765625 + fVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      sVar6 = sVar6 + 1;
      lVar5 = lVar5 + 0xc;
    } while (sVar6 != n);
  }
  return;
}

Assistant:

void            generate_points(const Bounds& domain, // overall data bounds
                                    size_t n)             // number of points
    {
        box = domain;
        points.resize(n);
        for (size_t i = 0; i < n; ++i)
            for (unsigned j = 0; j < DIM; ++j)
                points[i][j] = domain.min[j] + float(rand() % 1024)/1024 *
                    (domain.max[j] - domain.min[j]);
    }